

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O3

void Gia_ManDfsSlacksPrint(Gia_Man_t *p)

{
  uint uVar1;
  uint *__ptr;
  uint uVar2;
  int iVar3;
  Vec_Int_t *__ptr_00;
  ulong uVar4;
  Vec_Int_t *__s;
  ulong uVar5;
  Vec_Int_t *__ptr_01;
  uint uVar6;
  uint uVar7;
  
  __ptr_00 = Gia_ManDfsSlacks(p);
  uVar7 = __ptr_00->nSize;
  uVar5 = (ulong)uVar7;
  if (uVar5 == 0) {
    puts("Network contains no internal objects.");
    __ptr_01 = (Vec_Int_t *)__ptr_00->pArray;
    if (__ptr_01 == (Vec_Int_t *)0x0) goto LAB_0021a9b4;
  }
  else {
    __ptr = (uint *)__ptr_00->pArray;
    if ((int)uVar7 < 1) {
      uVar6 = *__ptr;
    }
    else {
      uVar4 = 0;
      do {
        if (__ptr[uVar4] != 0xffffffff) {
          __ptr[uVar4] = (int)__ptr[uVar4] / 10;
        }
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
      uVar6 = *__ptr;
      if (uVar7 != 1) {
        uVar4 = 1;
        do {
          if ((int)uVar6 <= (int)__ptr[uVar4]) {
            uVar6 = __ptr[uVar4];
          }
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
      }
    }
    uVar1 = uVar6 + 1;
    uVar2 = 0x10;
    if (0xe < uVar6) {
      uVar2 = uVar1;
    }
    if ((uVar2 == 0) || (__s = (Vec_Int_t *)malloc((long)(int)uVar2 << 2), __s == (Vec_Int_t *)0x0))
    {
      __s = (Vec_Int_t *)0x0;
    }
    else {
      memset(__s,0,(long)(int)uVar1 << 2);
    }
    if (0 < (int)uVar7) {
      uVar4 = 0;
      do {
        uVar7 = __ptr[uVar4];
        if ((ulong)uVar7 != 0xffffffff) {
          if (((int)uVar7 < 0) || ((int)uVar6 < (int)uVar7)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          (&__s->nCap)[uVar7] = (&__s->nCap)[uVar7] + 1;
        }
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
    if ((int)uVar6 < 0) {
LAB_0021a9e9:
      __assert_fail("nTotal > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMan.c"
                    ,0x498,"void Gia_ManDfsSlacksPrint(Gia_Man_t *)");
    }
    uVar5 = 0;
    iVar3 = 0;
    do {
      iVar3 = iVar3 + (&__s->nCap)[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
    if (iVar3 < 1) goto LAB_0021a9e9;
    uVar5 = 0;
    uVar7 = 0;
    do {
      uVar6 = (&__s->nCap)[uVar5];
      printf("Slack range %3d = ",uVar5 & 0xffffffff);
      uVar5 = uVar5 + 1;
      printf("[%4d, %4d)   ",(ulong)uVar7,(ulong)(uVar7 + 10));
      printf("Nodes = %5d  ",(ulong)uVar6);
      printf("(%6.2f %%) ",((double)(int)uVar6 * 100.0) / (double)iVar3);
      putchar(10);
      uVar7 = uVar7 + 10;
    } while (uVar1 != uVar5);
    free(__ptr);
    __ptr_01 = __ptr_00;
    __ptr_00 = __s;
  }
  free(__ptr_01);
LAB_0021a9b4:
  free(__ptr_00);
  return;
}

Assistant:

void Gia_ManDfsSlacksPrint( Gia_Man_t * p )
{
    Vec_Int_t * vCounts, * vSlacks = Gia_ManDfsSlacks( p );
    int i, Entry, nRange, nTotal;
    if ( Vec_IntSize(vSlacks) == 0 )
    {
        printf( "Network contains no internal objects.\n" );
        Vec_IntFree( vSlacks );
        return;
    }
    // compute slacks
    Vec_IntForEachEntry( vSlacks, Entry, i )
        if ( Entry != -1 )
            Vec_IntWriteEntry( vSlacks, i, Entry/10 );
    nRange = Vec_IntFindMax( vSlacks );
    // count items
    vCounts = Vec_IntStart( nRange + 1 );
    Vec_IntForEachEntry( vSlacks, Entry, i )
        if ( Entry != -1 )
            Vec_IntAddToEntry( vCounts, Entry, 1 );
    // print slack ranges
    nTotal = Vec_IntSum( vCounts );
    assert( nTotal > 0 );
    Vec_IntForEachEntry( vCounts, Entry, i )
    {
        printf( "Slack range %3d = ", i );
        printf( "[%4d, %4d)   ", 10*i, 10*(i+1) );
        printf( "Nodes = %5d  ", Entry );
        printf( "(%6.2f %%) ", 100.0*Entry/nTotal );
        printf( "\n" );
    }
    Vec_IntFree( vSlacks );
    Vec_IntFree( vCounts );
}